

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O3

bool __thiscall iDynTree::XMLParser::parseXMLFile(XMLParser *this,string *absoluteFileName)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long *plVar6;
  long *plVar7;
  _Head_base<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_false> _Var8;
  string message;
  long *local_b0;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  xmlCheckVersion(0x51b1);
  XMLParserState::resetState
            (&((this->m_pimpl)._M_t.
               super___uniq_ptr_impl<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
               ._M_t.
               super__Tuple_impl<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
               .super__Head_base<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_false>._M_head_impl)->
              m_parserState);
  _Var8._M_head_impl =
       (this->m_pimpl)._M_t.
       super___uniq_ptr_impl<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
       .super__Head_base<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_false>._M_head_impl;
  if ((_Var8._M_head_impl)->m_performValidation == true) {
    if (*(size_type *)((long)&(_Var8._M_head_impl)->m_schemaLocation + 8) == 0) {
      iDynTree::reportError
                ("XMLParser","parseXMLFile","Validation requested, but no schema has been specified"
                );
      return false;
    }
    uVar3 = xmlSchemaNewParserCtxt((pointer)((_Var8._M_head_impl)->m_schemaLocation)._M_dataplus);
    uVar4 = xmlSchemaParse(uVar3);
    uVar5 = xmlSchemaNewValidCtxt(uVar4);
    iVar2 = xmlSchemaValidateFile(uVar5,(absoluteFileName->_M_dataplus)._M_p,0);
    xmlSchemaFreeValidCtxt(uVar5);
    xmlSchemaFree(uVar4);
    xmlSchemaFreeParserCtxt(uVar3);
    if (iVar2 != 0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Failed to validate ","");
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_50,(ulong)(absoluteFileName->_M_dataplus)._M_p);
      plVar7 = plVar6 + 2;
      if ((long *)*plVar6 == plVar7) {
        local_80 = *plVar7;
        lStack_78 = plVar6[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar7;
        local_90 = (long *)*plVar6;
      }
      local_88 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
      plVar7 = plVar6 + 2;
      if ((long *)*plVar6 == plVar7) {
        local_60 = *plVar7;
        lStack_58 = plVar6[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar7;
        local_70 = (long *)*plVar6;
      }
      local_68 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_70,
                                  *(ulong *)&(((this->m_pimpl)._M_t.
                                               super___uniq_ptr_impl<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                                               .
                                               super__Head_base<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_false>
                                              ._M_head_impl)->m_schemaLocation)._M_dataplus);
      plVar7 = plVar6 + 2;
      if ((long *)*plVar6 == plVar7) {
        local_a0 = *plVar7;
        lStack_98 = plVar6[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar7;
        local_b0 = (long *)*plVar6;
      }
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      iDynTree::reportError("XMLParser","parseXMLFile",(char *)local_b0);
      if (local_b0 == &local_a0) {
        return false;
      }
      operator_delete(local_b0,local_a0 + 1);
      return false;
    }
    _Var8._M_head_impl =
         (this->m_pimpl)._M_t.
         super___uniq_ptr_impl<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
         .super__Head_base<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_false>._M_head_impl;
  }
  iVar2 = xmlSAXUserParseFile(_Var8._M_head_impl,this,(absoluteFileName->_M_dataplus)._M_p);
  if (iVar2 != 0) {
    return false;
  }
  bVar1 = XMLParserState::getParsingErrorState
                    (&((this->m_pimpl)._M_t.
                       super___uniq_ptr_impl<iDynTree::XMLParser::XMLParserPimpl,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_std::default_delete<iDynTree::XMLParser::XMLParserPimpl>_>
                       .super__Head_base<0UL,_iDynTree::XMLParser::XMLParserPimpl_*,_false>.
                      _M_head_impl)->m_parserState);
  return !bVar1;
}

Assistant:

bool XMLParser::parseXMLFile(std::string absoluteFileName)
    {
        assert(m_pimpl);
        LIBXML_TEST_VERSION

        // Reset the failure state.
        m_pimpl->m_parserState.resetState();
        
        if (m_pimpl->m_performValidation) {
            if (m_pimpl->m_schemaLocation.empty()) {
                reportError("XMLParser", "parseXMLFile", "Validation requested, but no schema has been specified");
                return false;
            }
            // Create necessary structures for the validator
            xmlSchemaParserCtxtPtr schemaParserContext = xmlSchemaNewParserCtxt(m_pimpl->m_schemaLocation.c_str());
            xmlSchemaPtr xmlSchema = xmlSchemaParse(schemaParserContext);
            xmlSchemaValidCtxtPtr validator = xmlSchemaNewValidCtxt(xmlSchema);
            
            // This is the actual validation. Note that there is the possibility to use
            // xmlSchemaSAXPlug which should perform the validation while parsing.
            // The code remains cleared in this way though, as the validation is optional.

            int validation = xmlSchemaValidateFile(validator, absoluteFileName.c_str(), 0);

            xmlSchemaFreeValidCtxt(validator);
            xmlSchemaFree(xmlSchema);
            xmlSchemaFreeParserCtxt(schemaParserContext);
            if (validation) {
                std::string message = std::string("Failed to validate ") + absoluteFileName + " for schema " + m_pimpl->m_schemaLocation;
                reportError("XMLParser", "parseXMLFile", message.c_str());
                return false;
            }
    
        }

//        xmlParserCtxtPtr parserContext = xmlCreatePushParserCtxt(m_pimpl->callbackHandler(),
//                                                                 this, NULL, 0, absoluteFileName.c_str());

        int result = xmlSAXUserParseFile(m_pimpl->callbackHandler(), this, absoluteFileName.c_str());
        return result == 0 && !m_pimpl->m_parserState.getParsingErrorState();
    }